

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void generic_mixed_endian(void)

{
  uint32_t val;
  int32_t val_00;
  uint64_t val_01;
  int64_t val_02;
  double dVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint8_t buf [2];
  uint16_t local_38;
  undefined2 uStack_36;
  undefined4 uStack_34;
  undefined8 local_30;
  float local_24;
  double local_20;
  
  iVar3 = greatest_pre_test("generic_mixed_endian_u16_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u16_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        uVar2 = local_38;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      pack_le_u16(&local_38,local_38);
      unpack_be_u16((uint16_t *)&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x285;
      if ((uint16_t)local_30 != uVar2) {
        pack_be_u16(&local_38,uVar2);
        unpack_le_u16((uint16_t *)&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x288;
        if ((uint16_t)local_30 != uVar2) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104c18;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104c18:
    greatest_post_test("generic_mixed_endian_u16_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_i16_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i16_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        uVar2 = local_38;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      pack_le_i16(&local_38,local_38);
      unpack_be_i16((int16_t *)&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x293;
      if ((uint16_t)local_30 != uVar2) {
        pack_be_i16(&local_38,uVar2);
        unpack_le_i16((int16_t *)&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x296;
        if ((uint16_t)local_30 != uVar2) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104d29;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104d29:
    greatest_post_test("generic_mixed_endian_i16_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_u32_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u32_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      val = CONCAT22(uStack_36,local_38);
      pack_le_u32(&local_38,val);
      unpack_be_u32((uint32_t *)&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2a1;
      if (CONCAT22(local_30._2_2_,(uint16_t)local_30) != val) {
        pack_be_u32(&local_38,val);
        unpack_le_u32((uint32_t *)&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2a4;
        if (CONCAT22(local_30._2_2_,(uint16_t)local_30) != val) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104e34;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104e34:
    greatest_post_test("generic_mixed_endian_u32_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_i32_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i32_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      val_00 = CONCAT22(uStack_36,local_38);
      pack_le_i32(&local_38,val_00);
      unpack_be_i32((int32_t *)&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2af;
      if (CONCAT22(local_30._2_2_,(uint16_t)local_30) != val_00) {
        pack_be_i32(&local_38,val_00);
        unpack_le_i32((int32_t *)&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2b2;
        if (CONCAT22(local_30._2_2_,(uint16_t)local_30) != val_00) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104f3f;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104f3f:
    greatest_post_test("generic_mixed_endian_i32_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_u64_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u64_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      val_01 = CONCAT44(uStack_34,CONCAT22(uStack_36,local_38));
      pack_le_u64(&local_38,val_01);
      unpack_be_u64(&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2bd;
      if (val_01 != CONCAT44(local_30._4_4_,CONCAT22(local_30._2_2_,(uint16_t)local_30))) {
        pack_be_u64(&local_38,val_01);
        unpack_le_u64(&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2c0;
        if (val_01 != CONCAT44(local_30._4_4_,CONCAT22(local_30._2_2_,(uint16_t)local_30))) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_0010504c;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_0010504c:
    greatest_post_test("generic_mixed_endian_u64_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_i64_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i64_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      val_02 = CONCAT44(uStack_34,CONCAT22(uStack_36,local_38));
      pack_le_i64(&local_38,val_02);
      unpack_be_i64(&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2cb;
      if (val_02 != CONCAT44(local_30._4_4_,CONCAT22(local_30._2_2_,(uint16_t)local_30))) {
        pack_be_i64(&local_38,val_02);
        unpack_le_i64(&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2ce;
        if (val_02 != CONCAT44(local_30._4_4_,CONCAT22(local_30._2_2_,(uint16_t)local_30))) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00105159;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00105159:
    greatest_post_test("generic_mixed_endian_i64_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_f_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_f_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = random();
      lVar6 = 0;
      do {
        *(char *)((long)&local_38 + lVar6) = (char)lVar6 + (char)lVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      local_24 = (float)CONCAT44(uStack_34,CONCAT22(uStack_36,local_38));
      pack_le_f(&local_38,local_24);
      unpack_be_f((float *)&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2d9;
      if (((float)CONCAT22(local_30._2_2_,(uint16_t)local_30) != local_24) ||
         (NAN((float)CONCAT22(local_30._2_2_,(uint16_t)local_30)) || NAN(local_24))) {
        pack_be_f(&local_38,local_24);
        unpack_le_f((float *)&local_30,&local_38);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2dc;
        if (((float)CONCAT22(local_30._2_2_,(uint16_t)local_30) != local_24) ||
           (NAN((float)CONCAT22(local_30._2_2_,(uint16_t)local_30)) || NAN(local_24))) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_001052a6;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_001052a6:
    greatest_post_test("generic_mixed_endian_f_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_d_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) == 0) {
      return;
    }
    fprintf(_stdout,"  %s\n","generic_mixed_endian_d_should_not_match");
    return;
  }
  iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar3 == 0) {
    lVar5 = random();
    local_20 = (double)((float)lVar5 * 4.656613e-10);
    pack_le_d(&local_38,local_20);
    unpack_be_d((double *)&local_30,&local_38);
    greatest_info.assertions = greatest_info.assertions + 1;
    dVar1 = (double)CONCAT44(local_30._4_4_,CONCAT22(local_30._2_2_,(uint16_t)local_30));
    uVar4 = 0x2e7;
    if ((dVar1 != local_20) || (NAN(dVar1) || NAN(local_20))) {
      pack_be_d(&local_38,local_20);
      unpack_le_d((double *)&local_30,&local_38);
      greatest_info.assertions = greatest_info.assertions + 1;
      dVar1 = (double)CONCAT44(local_30._4_4_,CONCAT22(local_30._2_2_,(uint16_t)local_30));
      uVar4 = 0x2ea;
      if ((dVar1 != local_20) || (NAN(dVar1) || NAN(local_20))) {
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
        goto LAB_00105396;
      }
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    iVar3 = -1;
    greatest_info.msg = "wrote == unpack";
    greatest_info.fail_line = uVar4;
  }
LAB_00105396:
  greatest_post_test("generic_mixed_endian_d_should_not_match",iVar3);
  return;
}

Assistant:

SUITE(generic_mixed_endian) {
    RUN_TEST(generic_mixed_endian_u16_should_not_match);
    RUN_TEST(generic_mixed_endian_i16_should_not_match);
    RUN_TEST(generic_mixed_endian_u32_should_not_match);
    RUN_TEST(generic_mixed_endian_i32_should_not_match);
    RUN_TEST(generic_mixed_endian_u64_should_not_match);
    RUN_TEST(generic_mixed_endian_i64_should_not_match);
    RUN_TEST(generic_mixed_endian_f_should_not_match);
    RUN_TEST(generic_mixed_endian_d_should_not_match);
}